

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::operator=(QString *this,QLatin1StringView other)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  char16_t *pcVar5;
  QString *this_00;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  size_t in_stack_00000018;
  char *in_stack_00000020;
  char16_t *in_stack_00000028;
  qsizetype capacityAtEnd;
  QString *in_stack_ffffffffffffff88;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff98;
  qsizetype in_stack_ffffffffffffffa8;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QString *)0x1d3b34);
  qVar3 = QArrayDataPointer<char16_t>::freeSpaceAtBegin(in_stack_ffffffffffffff98);
  bVar1 = isDetached((QString *)0x1d3b5d);
  if ((bVar1) && (qVar4 = QLatin1StringView::size(&local_18), qVar4 <= qVar2 - qVar3)) {
    qVar2 = QLatin1StringView::size(&local_18);
    in_RDI->size = qVar2;
    pcVar5 = QArrayDataPointer<char16_t>::data(in_RDI);
    qVar2 = QLatin1StringView::size(&local_18);
    pcVar5[qVar2] = L'\0';
    QArrayDataPointer<char16_t>::data(in_RDI);
    QLatin1StringView::latin1(&local_18);
    QLatin1StringView::size(&local_18);
    qt_from_latin1(in_stack_00000028,in_stack_00000020,in_stack_00000018);
  }
  else {
    this_00 = (QString *)QLatin1StringView::latin1(&local_18);
    QLatin1StringView::size(&local_18);
    fromLatin1((char *)in_RDI,in_stack_ffffffffffffffa8);
    operator=(this_00,in_stack_ffffffffffffff88);
    ~QString((QString *)0x1d3c2c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString &QString::operator=(QLatin1StringView other)
{
    const qsizetype capacityAtEnd = capacity() - d.freeSpaceAtBegin();
    if (isDetached() && other.size() <= capacityAtEnd) { // assumes d->alloc == 0 -> !isDetached() (sharedNull)
        d.size = other.size();
        d.data()[other.size()] = 0;
        qt_from_latin1(d.data(), other.latin1(), other.size());
    } else {
        *this = fromLatin1(other.latin1(), other.size());
    }
    return *this;
}